

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

vec2 vec2_reflect(vec2 u,vec2 v)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar4 = v.x;
  fVar5 = v.y;
  fVar2 = u.x;
  fVar3 = u.y;
  fVar8 = fVar4 * fVar4 + fVar5 * fVar5;
  fVar6 = 0.0;
  fVar7 = 0.0;
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    fVar8 = (fVar2 * fVar4 + fVar3 * fVar5) / fVar8;
    fVar6 = fVar8 * fVar4;
    fVar7 = fVar8 * fVar5;
    fVar2 = fVar2 - fVar6;
    fVar3 = fVar3 - fVar7;
  }
  vVar1.y = fVar3 - fVar7;
  vVar1.x = fVar2 - fVar6;
  return vVar1;
}

Assistant:

vec2 vec2_reflect(vec2 u, vec2 v) {
    return vec2_sub(vec2_perpindicular_component(u, v), vec2_parallel_component(u, v));
}